

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

void fill_window(deflate_state *s)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  z_streamp_conflict pzVar4;
  Bytef *pBVar5;
  uint uVar6;
  ushort *puVar7;
  uLong uVar8;
  ushort uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  size_t __n;
  ulg uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  
  uVar1 = s->w_size;
  uVar12 = (ulong)uVar1;
  do {
    uVar14 = (int)s->window_size - (s->lookahead + s->strstart);
    if (s->w_size + (uVar1 - 0x106) <= s->strstart) {
      memcpy(s->window,s->window + uVar12,uVar12);
      s->match_start = s->match_start - uVar1;
      s->strstart = s->strstart - uVar1;
      s->block_start = s->block_start - uVar12;
      uVar16 = (ulong)s->hash_size;
      puVar7 = s->head + uVar16;
      do {
        puVar7 = puVar7 + -1;
        uVar9 = *puVar7 - (short)uVar1;
        if (*puVar7 < uVar1) {
          uVar9 = 0;
        }
        *puVar7 = uVar9;
        uVar6 = (int)uVar16 - 1;
        uVar16 = (ulong)uVar6;
      } while (uVar6 != 0);
      puVar7 = s->prev + (uVar12 - 1);
      uVar6 = uVar1;
      do {
        uVar9 = *puVar7 - (short)uVar1;
        if (*puVar7 < uVar1) {
          uVar9 = 0;
        }
        *puVar7 = uVar9;
        puVar7 = puVar7 + -1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      uVar14 = uVar14 + uVar1;
    }
    pzVar4 = s->strm;
    uVar6 = pzVar4->avail_in;
    if (uVar6 == 0) {
      return;
    }
    uVar11 = uVar14;
    if (uVar6 < uVar14) {
      uVar11 = uVar6;
    }
    uVar16 = (ulong)uVar11;
    if (uVar14 == 0) {
      uVar11 = 0;
    }
    else {
      uVar14 = s->strstart;
      uVar2 = s->lookahead;
      pBVar5 = s->window;
      pzVar4->avail_in = uVar6 - uVar11;
      iVar3 = pzVar4->state->wrap;
      if (iVar3 == 2) {
        uVar8 = crc32(pzVar4->adler,pzVar4->next_in,uVar11);
LAB_008d125d:
        pzVar4->adler = uVar8;
      }
      else if (iVar3 == 1) {
        uVar8 = adler32(pzVar4->adler,pzVar4->next_in,uVar11);
        goto LAB_008d125d;
      }
      memcpy(pBVar5 + (ulong)uVar2 + (ulong)uVar14,pzVar4->next_in,uVar16);
      pzVar4->next_in = pzVar4->next_in + uVar16;
      pzVar4->total_in = pzVar4->total_in + uVar16;
    }
    uVar11 = uVar11 + s->lookahead;
    s->lookahead = uVar11;
    if (2 < uVar11) {
      uVar14 = (uint)s->window[s->strstart];
      s->ins_h = uVar14;
      s->ins_h = ((uint)s->window[s->strstart + 1] ^ uVar14 << ((byte)s->hash_shift & 0x1f)) &
                 s->hash_mask;
    }
    if ((0x105 < uVar11) || (s->strm->avail_in == 0)) {
      uVar12 = s->high_water;
      uVar16 = s->window_size;
      uVar10 = uVar16 - uVar12;
      if (uVar12 <= uVar16 && uVar10 != 0) {
        uVar15 = (ulong)uVar11 + (ulong)s->strstart;
        if (uVar12 < uVar15) {
          __n = uVar16 - uVar15;
          if (0x101 < __n) {
            __n = 0x102;
          }
          memset(s->window + uVar15,0,__n);
          uVar13 = __n + uVar15;
        }
        else {
          uVar16 = (uVar15 + 0x102) - uVar12;
          if (uVar15 + 0x102 < uVar12 || uVar16 == 0) {
            return;
          }
          if (uVar16 < uVar10) {
            uVar10 = uVar16;
          }
          memset(s->window + uVar12,0,uVar10 & 0xffffffff);
          uVar13 = uVar10 + s->high_water;
        }
        s->high_water = uVar13;
      }
      return;
    }
  } while( true );
}

Assistant:

local void fill_window(deflate_state *s)
{
    register unsigned n, m;
    register Posf *p;
    unsigned more;    /* Amount of free space at the end of the window. */
    uInt wsize = s->w_size;

    do {
        more = (unsigned)(s->window_size -(ulg)s->lookahead -(ulg)s->strstart);

        /* Deal with !@#$% 64K limit: */
        if (sizeof(int) <= 2) {
            if (more == 0 && s->strstart == 0 && s->lookahead == 0) {
                more = wsize;

            } else if (more == (unsigned)(-1)) {
                /* Very unlikely, but possible on 16 bit machine if
                 * strstart == 0 && lookahead == 1 (input done a byte at time)
                 */
                more--;
            }
        }

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (s->strstart >= wsize+MAX_DIST(s)) {

            zmemcpy(s->window, s->window+wsize, (unsigned)wsize);
            s->match_start -= wsize;
            s->strstart    -= wsize; /* we now have strstart >= MAX_DIST */
            s->block_start -= (long) wsize;

            /* Slide the hash table (could be avoided with 32 bit values
               at the expense of memory usage). We slide even when level == 0
               to keep the hash table consistent if we switch back to level > 0
               later. (Using level 0 permanently is not an optimal usage of
               zlib, so we don't care about this pathological case.)
             */
            n = s->hash_size;
            p = &s->head[n];
            do {
                m = *--p;
                *p = (Pos)(m >= wsize ? m-wsize : NIL);
            } while (--n);

            n = wsize;
#ifndef FASTEST
            p = &s->prev[n];
            do {
                m = *--p;
                *p = (Pos)(m >= wsize ? m-wsize : NIL);
                /* If n is not on any hash chain, prev[n] is garbage but
                 * its value will never be used.
                 */
            } while (--n);
#endif
            more += wsize;
        }
        if (s->strm->avail_in == 0) return;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the BIG_MEM or MMAP case (not yet supported),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + s->lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = read_buf(s->strm, s->window + s->strstart + s->lookahead, more);
        s->lookahead += n;

        /* Initialize the hash value now that we have some input: */
        if (s->lookahead >= MIN_MATCH) {
            s->ins_h = s->window[s->strstart];
            UPDATE_HASH(s, s->ins_h, s->window[s->strstart+1]);
#if MIN_MATCH != 3
            Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
        }
        /* If the whole input has less than MIN_MATCH bytes, ins_h is garbage,
         * but this is not important since only literal bytes will be emitted.
         */

    } while (s->lookahead < MIN_LOOKAHEAD && s->strm->avail_in != 0);

    /* If the WIN_INIT bytes after the end of the current data have never been
     * written, then zero those bytes in order to avoid memory check reports of
     * the use of uninitialized (or uninitialised as Julian writes) bytes by
     * the longest match routines.  Update the high water mark for the next
     * time through here.  WIN_INIT is set to MAX_MATCH since the longest match
     * routines allow scanning to strstart + MAX_MATCH, ignoring lookahead.
     */
    if (s->high_water < s->window_size) {
        ulg curr = s->strstart + (ulg)(s->lookahead);
        ulg init;

        if (s->high_water < curr) {
            /* Previous high water mark below current data -- zero WIN_INIT
             * bytes or up to end of window, whichever is less.
             */
            init = s->window_size - curr;
            if (init > WIN_INIT)
                init = WIN_INIT;
            zmemzero(s->window + curr, (unsigned)init);
            s->high_water = curr + init;
        }
        else if (s->high_water < (ulg)curr + WIN_INIT) {
            /* High water mark at or above current data, but below current data
             * plus WIN_INIT -- zero out to current data plus WIN_INIT, or up
             * to end of window, whichever is less.
             */
            init = (ulg)curr + WIN_INIT - s->high_water;
            if (init > s->window_size - s->high_water)
                init = s->window_size - s->high_water;
            zmemzero(s->window + s->high_water, (unsigned)init);
            s->high_water += init;
        }
    }
}